

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteCallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (ByteCodeWriter *this,OpCode op,RegSlot returnValueRegister,RegSlot functionRegister,
          ArgSlot givenArgCount,CallIExtendedOptions options,uint32 spreadArgsOffset)

{
  bool bVar1;
  uchar local_31;
  short sStack_30;
  unsigned_short uStack_2e;
  CallIExtendedOptions CStack_2c;
  undefined1 auStack_2b [2];
  OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  CallIExtendedOptions options_local;
  ArgSlot givenArgCount_local;
  RegSlot functionRegister_local;
  RegSlot returnValueRegister_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  layout.super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.Return._1_1_ = options;
  layout.super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.Function = givenArgCount;
  layout._5_4_ = functionRegister;
  unique0x100000d4 = returnValueRegister;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<short,unsigned_int>
                    (&sStack_30,returnValueRegister);
  if ((((bVar1) &&
       (bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_short,unsigned_int>
                          (&uStack_2e,layout._5_4_), bVar1)) &&
      (bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_char,unsigned_short>
                         (&local_31,
                          layout.super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.
                          Function), bVar1)) &&
     ((bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::
               Assign<Js::CallIExtendedOptions,Js::CallIExtendedOptions>
                         (&CStack_2c,
                          layout.super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.
                          Return._1_1_), bVar1 &&
      (bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_int,unsigned_int>
                         ((uint *)auStack_2b,spreadArgsOffset), bVar1)))) {
    Data::EncodeT<(Js::LayoutSize)1>(&this->m_byteCodeData,op,&local_31,10,this);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ByteCodeWriter::TryWriteCallIExtended(OpCode op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, CallIExtendedOptions options, uint32 spreadArgsOffset)
    {
        OpLayoutT_CallIExtended<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Return, returnValueRegister) && SizePolicy::Assign(layout.Function, functionRegister)
            && SizePolicy::Assign(layout.ArgCount, givenArgCount) && SizePolicy::Assign(layout.Options, options)
            && SizePolicy::Assign(layout.SpreadAuxOffset, spreadArgsOffset))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }